

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O3

FunctionMatch * __thiscall
Jinx::Impl::Parser::CheckFunctionCall
          (FunctionMatch *__return_storage_ptr__,Parser *this,FunctionSignature *signature,
          SymbolListCItr currSym,SymbolListCItr endSym,bool skipInitialParam)

{
  bool bVar1;
  size_t partsIndex;
  undefined7 in_register_00000089;
  FunctionMatch match;
  undefined1 local_68 [8];
  _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
  _Stack_60;
  tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool> local_40;
  
  _Stack_60._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _Stack_60._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68 = (undefined1  [8])0x0;
  _Stack_60._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (((int)CONCAT71(in_register_00000089,skipInitialParam) == 0) ||
     (((signature->m_parts).
       super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
       ._M_impl.super__Vector_impl_data._M_start)->partType != Parameter)) {
    partsIndex = 0;
  }
  else {
    local_40.super__Tuple_impl<0UL,_Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>.
    super__Tuple_impl<1UL,_unsigned_long,_bool>.super__Tuple_impl<2UL,_bool>.
    super__Head_base<2UL,_bool,_false>._M_head_impl = (_Head_base<2UL,_bool,_false>)false;
    local_40.super__Tuple_impl<0UL,_Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>.
    super__Tuple_impl<1UL,_unsigned_long,_bool>.super__Head_base<1UL,_unsigned_long,_false>.
    _M_head_impl = 0;
    local_40.super__Tuple_impl<0UL,_Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>.
    super__Head_base<0UL,_Jinx::Impl::FunctionSignaturePartType,_false>._M_head_impl = Parameter;
    std::
    vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>,Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>>>
    ::emplace_back<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>>
              ((vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>,Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,unsigned_long,bool>>>
                *)&_Stack_60,&local_40);
    partsIndex = 1;
  }
  bVar1 = CheckFunctionCallPart
                    (this,&signature->m_parts,partsIndex,currSym,endSym,(FunctionMatch *)local_68);
  if (bVar1) {
    __return_storage_ptr__->signature = signature;
    (__return_storage_ptr__->partData).
    super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
    ._M_impl.super__Vector_impl_data._M_start = _Stack_60._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->partData).
    super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = _Stack_60._M_impl.super__Vector_impl_data._M_finish
    ;
    (__return_storage_ptr__->partData).
    super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         _Stack_60._M_impl.super__Vector_impl_data._M_end_of_storage;
    _Stack_60._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    _Stack_60._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    _Stack_60._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68 = (undefined1  [8])signature;
  }
  else {
    (__return_storage_ptr__->partData).
    super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->partData).
    super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __return_storage_ptr__->signature = (FunctionSignature *)0x0;
    (__return_storage_ptr__->partData).
    super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  }
  std::
  _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
  ::~_Vector_base(&_Stack_60);
  return __return_storage_ptr__;
}

Assistant:

inline_t Parser::FunctionMatch Parser::CheckFunctionCall(const FunctionSignature & signature, SymbolListCItr currSym, SymbolListCItr endSym, bool skipInitialParam) const
	{
		FunctionMatch match;
		const auto & parts = signature.GetParts();
		size_t partsIndex = 0;
		if (skipInitialParam && signature.GetParts()[0].partType == FunctionSignaturePartType::Parameter)
		{
			partsIndex++;
			match.partData.push_back(std::make_tuple(FunctionSignaturePartType::Parameter, 0, false));
		}
		if (CheckFunctionCallPart(parts, partsIndex, currSym, endSym, match))
		{
			match.signature = &signature;
			return match;
		}
		return FunctionMatch();
	}